

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testAddDoubleWithTagsVector_Test::~Engine_testAddDoubleWithTagsVector_Test
          (Engine_testAddDoubleWithTagsVector_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Engine, testAddDoubleWithTagsVector) {
    Engine e("test", std::make_unique<TestHandler>());
    std::vector<Tag> tags;
    tags.reserve(2);
    Tag::appendTag(tags, "Hello", "World");
    Tag::appendTag(tags, "Another", "Tag");
    e.Add("foo", 10.5, tags);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto dm = th->doubleMeasures[0];
    ASSERT_EQ("test.foo", dm.name);
    ASSERT_EQ(MetricType::Counter, dm.type);
    ASSERT_EQ(1, dm.rate);
    ASSERT_EQ(10.5, dm.value);
    ASSERT_EQ(2, dm.tags.size());
    ASSERT_EQ("Hello", dm.tags[0].name);
    ASSERT_EQ("World", dm.tags[0].value);
    ASSERT_EQ("Another", dm.tags[1].name);
    ASSERT_EQ("Tag", dm.tags[1].value);
}